

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall regex_scan_frame::is_recursing(regex_scan_frame *this)

{
  regex_scan_frame *fr;
  regex_scan_frame *this_local;
  
  fr = this->parent;
  while( true ) {
    if (fr == (regex_scan_frame *)0x0) {
      return 0;
    }
    if (fr->st == this->st) break;
    fr = fr->parent;
  }
  return 1;
}

Assistant:

int is_recursing()
    {
        /* search up the parent chain for a duplicate of my state */
        for (regex_scan_frame *fr = parent ; fr != 0 ; fr = fr->parent)
        {
            if (fr->st == st)
                return TRUE;
        }

        /* didn't find it */
        return FALSE;
    }